

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_ARB1_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  uint uVar1;
  SourceMod SVar2;
  MOJOSHADER_shaderType shader_type;
  RegisterType rtype;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  ulong *puVar9;
  char *fmt;
  size_t in_R8;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  char acStack_138 [56];
  code *pcStack_100;
  char acStack_f8 [56];
  undefined8 uStack_c0;
  ulong uStack_b8;
  char rel_offset [32];
  ulong uStack_88;
  char regnum_str [16];
  char local_68 [8];
  char swizzle_str [6];
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined4 local_34;
  char rel_swizzle [4];
  
  puVar9 = &uStack_b8;
  uStack_88 = 0;
  regnum_str[0] = '\0';
  regnum_str[1] = '\0';
  regnum_str[2] = '\0';
  regnum_str[3] = '\0';
  regnum_str[4] = '\0';
  regnum_str[5] = '\0';
  regnum_str[6] = '\0';
  regnum_str[7] = '\0';
  if (arg->relative == 0) {
    uStack_c0 = 0x121c4a;
    local_40 = get_D3D_register_string(ctx,arg->regtype,arg->regnum,(char *)&uStack_88,in_R8);
  }
  else {
    local_40 = (char *)0x0;
  }
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  uStack_b8 = 0;
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  local_34 = 0;
  if (arg->relative == 0) {
    local_50 = "";
    local_48 = "";
    pcVar5 = "";
  }
  else {
    local_50 = acStack_f8;
    pcStack_100 = (code *)0x121c95;
    pcVar5 = get_D3D_register_string(ctx,arg->relative_regtype,arg->relative_regnum,local_68,in_R8);
    pcStack_100 = (code *)0x121cb1;
    snprintf(local_50,0x40,"%s%s",pcVar5,local_68);
    uVar1 = local_34;
    local_34._0_2_ = CONCAT11("xyzw"[arg->relative_component],0x2e);
    local_34._3_1_ = SUB41(uVar1,3);
    local_34._0_3_ = (uint3)(ushort)local_34;
    if (ctx->profile_supports_nv2 == 0) {
      if (arg->relative_regtype != REG_TYPE_ADDRESS) {
        pcStack_100 = (code *)0x1221c0;
        __assert_fail("arg->relative_regtype == REG_TYPE_ADDRESS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x193f,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (arg->relative_regnum != 0) {
        pcStack_100 = get_ARB1_destarg_varname;
        __assert_fail("arg->relative_regnum == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1940,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      if (ctx->last_address_reg_component != arg->relative_component) {
        pcStack_100 = (code *)0x121d0e;
        output_line(ctx,"ARL %s.x, addr%d.%c;",local_50,0);
        ctx->last_address_reg_component = arg->relative_component;
      }
      local_34._0_2_ = CONCAT11(0x78,(undefined1)local_34);
    }
    if (arg->regtype == REG_TYPE_INPUT) {
      local_40 = "vertex.attrib";
      puVar9 = (ulong *)local_50;
    }
    else {
      if (arg->regtype != REG_TYPE_CONST) {
        pcStack_100 = (code *)0x122182;
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1950,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      uVar1 = arg->relative_array->index;
      uVar7 = arg->regnum;
      uVar10 = uVar7 - uVar1;
      if ((int)uVar10 < 0) {
        pcStack_100 = (code *)0x1221a1;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1954,
                      "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
      local_40 = acStack_138;
      snprintf(local_40,0x40,"c_array_%d_%d",(ulong)uVar1,(ulong)(uint)arg->relative_array->count);
      puVar9 = (ulong *)local_40;
      if (uVar7 != uVar1) {
        snprintf((char *)&uStack_b8,0x20," + %d",(ulong)uVar10);
      }
    }
    pcVar5 = "[";
    local_48 = "]";
  }
  *(char **)((long)puVar9 + -8) = local_48;
  *(ulong **)((long)puVar9 + -0x10) = &uStack_b8;
  *(undefined4 **)((long)puVar9 + -0x18) = &local_34;
  *(char **)((long)puVar9 + -0x20) = local_50;
  *(undefined8 *)((long)puVar9 + -0x28) = 0x121e13;
  snprintf(buf,0x40,"%s%s%s%s%s%s%s",local_40,&uStack_88,pcVar5);
  SVar2 = arg->src_mod;
  if ((SRCMOD_NEGATE < SVar2) && ((SVar2 != SRCMOD_ABS || (ctx->profile_supports_nv2 == 0)))) {
    local_40 = (char *)((long)puVar9 + -0x40);
    iVar4 = ctx->scratch_registers;
    iVar3 = iVar4 + 1;
    ctx->scratch_registers = iVar3;
    if (ctx->max_scratch_registers <= iVar4) {
      ctx->max_scratch_registers = iVar3;
    }
    *(undefined8 *)((long)puVar9 + -0x48) = 0x121e84;
    snprintf(local_40,0x40,"scratch%d");
    uStack_88 = uStack_88 & 0xffffffffffffff00;
    uStack_b8 = uStack_b8 & 0xffffffffffffff00;
    local_34 = local_34 & 0xffffff00;
    pcVar5 = "";
    local_48 = "";
    local_50 = "";
    puVar9 = (ulong *)local_40;
  }
  pcVar8 = "";
  local_58 = "";
  switch(SVar2) {
  case SRCMOD_NEGATE:
    pcVar8 = "-";
    break;
  case SRCMOD_BIASNEGATE:
    pcVar8 = "-";
  case SRCMOD_BIAS:
    fmt = "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };";
LAB_00121fe2:
    *(char *)((long)puVar9 + -8) = -0xd;
    *(char *)((long)puVar9 + -7) = '\x1f';
    *(char *)((long)puVar9 + -6) = '\x12';
    *(char *)((long)puVar9 + -5) = '\0';
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    output_line(ctx,fmt,local_40,buf);
    break;
  case SRCMOD_SIGN:
    goto switchD_00121ecc_caseD_4;
  case SRCMOD_SIGNNEGATE:
    pcVar8 = "-";
    goto switchD_00121ecc_caseD_4;
  case SRCMOD_COMPLEMENT:
    *(char *)((long)puVar9 + -8) = -0x5a;
    *(char *)((long)puVar9 + -7) = '\x1f';
    *(char *)((long)puVar9 + -6) = '\x12';
    *(char *)((long)puVar9 + -5) = '\0';
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    output_line(ctx,"SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",local_40,buf);
    pcVar8 = "";
    break;
  case SRCMOD_X2:
    goto switchD_00121ecc_caseD_7;
  case SRCMOD_X2NEGATE:
    pcVar8 = "-";
    goto switchD_00121ecc_caseD_7;
  case SRCMOD_DZ:
    *(char *)((long)puVar9 + -8) = -0x39;
    *(char *)((long)puVar9 + -7) = '\x1f';
    *(char *)((long)puVar9 + -6) = '\x12';
    *(char *)((long)puVar9 + -5) = '\0';
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_DZ currently unsupported in arb1");
    local_58 = "_dz";
    goto LAB_00121fd5;
  case SRCMOD_DW:
    builtin_strncpy((char *)((long)puVar9 + -8),"^\x1f\x12",4);
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_DW currently unsupported in arb1");
    local_58 = "_dw";
LAB_00121fd5:
    pcVar8 = "";
    break;
  case SRCMOD_ABS:
    goto switchD_00121ecc_caseD_b;
  case SRCMOD_ABSNEGATE:
    pcVar8 = "-";
switchD_00121ecc_caseD_b:
    if (ctx->profile_supports_nv2 != 0) {
      pcVar8 = "-|";
      local_58 = "|";
      if (SVar2 != SRCMOD_ABSNEGATE) {
        pcVar8 = "|";
      }
      break;
    }
    fmt = "ABS %s, %s;";
    goto LAB_00121fe2;
  case SRCMOD_NOT:
    builtin_strncpy((char *)((long)puVar9 + -8),":\x1f\x12",4);
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    failf(ctx,"%s","SRCMOD_NOT currently unsupported in arb1");
    pcVar8 = "!";
  }
  if (((ctx->profile_supports_nv4 == 0) || (arg->regtype != REG_TYPE_MISCTYPE)) ||
     (arg->regnum != 1)) {
    uVar12 = 0;
  }
  else {
    local_68[0] = '.';
    local_68[1] = 'x';
    uVar12 = 2;
  }
  shader_type = ctx->shader_type;
  iVar4 = arg->regnum;
  rtype = arg->regtype;
  builtin_strncpy((char *)((long)puVar9 + -8),"5 \x12",4);
  *(char *)((long)puVar9 + -4) = '\0';
  *(char *)((long)puVar9 + -3) = '\0';
  *(char *)((long)puVar9 + -2) = '\0';
  *(char *)((long)puVar9 + -1) = '\0';
  iVar4 = isscalar(ctx,shader_type,rtype,iVar4);
  if ((iVar4 == 0) && (uVar1 = arg->swizzle, uVar1 != 0xe4)) {
    uVar6 = uVar12 | 1;
    local_68[uVar12] = '.';
    uVar7 = uVar1 >> 2 & 3;
    if (((uVar1 & 3) == uVar7) &&
       ((uVar10 = uVar1 >> 4 & 3, uVar7 == uVar10 && (uVar10 == (uVar1 >> 6 & 3))))) {
      piVar11 = &arg->swizzle_x;
      uVar12 = uVar12 + 2;
    }
    else {
      local_68[uVar6] = "xyzw"[arg->swizzle_x];
      local_68[uVar12 + 2] = "xyzw"[arg->swizzle_y];
      uVar6 = uVar12 + 4;
      local_68[uVar12 + 3] = "xyzw"[arg->swizzle_z];
      piVar11 = &arg->swizzle_w;
      uVar12 = uVar12 | 5;
    }
    local_68[uVar6] = "xyzw"[*piVar11];
  }
  local_68[uVar12] = '\0';
  if (5 < uVar12) {
    builtin_strncpy((char *)((long)puVar9 + -8),"c!\x12",4);
    *(char *)((long)puVar9 + -4) = '\0';
    *(char *)((long)puVar9 + -3) = '\0';
    *(char *)((long)puVar9 + -2) = '\0';
    *(char *)((long)puVar9 + -1) = '\0';
    __assert_fail("i < sizeof (swizzle_str)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x19de,
                  "const char *make_ARB1_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                 );
  }
  *(char **)((long)puVar9 + -0x10) = local_58;
  *(char **)((long)puVar9 + -0x18) = local_68;
  *(char **)((long)puVar9 + -0x20) = local_48;
  *(ulong **)((long)puVar9 + -0x28) = &uStack_b8;
  *(undefined4 **)((long)puVar9 + -0x30) = &local_34;
  *(char **)((long)puVar9 + -0x38) = local_50;
  *(char **)((long)puVar9 + -0x40) = pcVar5;
  *(char *)((long)puVar9 + -0x48) = '.';
  *(char *)((long)puVar9 + -0x47) = '!';
  *(char *)((long)puVar9 + -0x46) = '\x12';
  *(char *)((long)puVar9 + -0x45) = '\0';
  *(char *)((long)puVar9 + -0x44) = '\0';
  *(char *)((long)puVar9 + -0x43) = '\0';
  *(char *)((long)puVar9 + -0x42) = '\0';
  *(char *)((long)puVar9 + -0x41) = '\0';
  snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s%s",pcVar8,local_40,&uStack_88);
  return buf;
switchD_00121ecc_caseD_7:
  fmt = "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };";
  goto LAB_00121fe2;
switchD_00121ecc_caseD_4:
  fmt = "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };";
  goto LAB_00121fe2;
}

Assistant:

static const char *make_ARB1_srcarg_string_in_buf(Context *ctx,
                                                  const SourceArgInfo *arg,
                                                  char *buf, size_t buflen)
{
    // !!! FIXME: this can hit pathological cases where we look like this...
    //
    //    dp3 r1.xyz, t0_bx2, t0_bx2
    //    mad r1.xyz, t0_bias, 1-r1, t0_bx2
    //
    // ...which do a lot of duplicate work in arb1...
    //
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch0, scratch0, { 2.0, 2.0, 2.0, 2.0 };
    //    SUB scratch1, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch1, scratch1, { 2.0, 2.0, 2.0, 2.0 };
    //    DP3 r1.xyz, scratch0, scratch1;
    //    SUB scratch0, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    SUB scratch1, { 1.0, 1.0, 1.0, 1.0 }, r1;
    //    SUB scratch2, t0, { 0.5, 0.5, 0.5, 0.5 };
    //    MUL scratch2, scratch2, { 2.0, 2.0, 2.0, 2.0 };
    //    MAD r1.xyz, scratch0, scratch1, scratch2;
    //
    // ...notice that the dp3 calculates the same value into two scratch
    //  registers. This case is easier to handle; just see if multiple
    //  source args are identical, build it up once, and use the same
    //  scratch register for multiple arguments in that opcode.
    //  Even better still, only calculate things once across instructions,
    //  and be smart about letting it linger in a scratch register until we
    //  definitely don't need the calculation anymore. That's harder to
    //  write, though.

    char regnum_str[16] = { '\0' };

    // !!! FIXME: use get_ARB1_varname_in_buf() instead?
    const char *regtype_str = NULL;
    if (!arg->relative)
    {
        regtype_str = get_ARB1_register_string(ctx, arg->regtype,
                                               arg->regnum, regnum_str,
                                               sizeof (regnum_str));
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_regtype_str = get_ARB1_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);

        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';

        if (!support_nv2(ctx))
        {
            // The address register in ARB1 only allows the '.x' component, so
            //  we need to load the component we need from a temp vector
            //  register into .x as needed.
            assert(arg->relative_regtype == REG_TYPE_ADDRESS);
            assert(arg->relative_regnum == 0);
            if (ctx->last_address_reg_component != arg->relative_component)
            {
                output_line(ctx, "ARL %s.x, addr%d.%c;", rel_regtype_str,
                            arg->relative_regnum,
                            swizzle_channels[arg->relative_component]);
                ctx->last_address_reg_component = arg->relative_component;
            } // if

            rel_swizzle[1] = 'x';
        } // if

        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str = "vertex.attrib";
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int arraysize = arg->relative_array->count;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            regtype_str = get_ARB1_const_array_varname_in_buf(ctx, arrayidx,
                                           arraysize, (char *) alloca(64), 64);
            if (offset != 0)
                snprintf(rel_offset, sizeof (rel_offset), " + %d", offset);
        } // else

        rel_lbracket = "[";
        rel_rbracket = "]";
    } // if

    // This is the source register with everything but swizzle and source mods.
    snprintf(buf, buflen, "%s%s%s%s%s%s%s", regtype_str, regnum_str,
             rel_lbracket, rel_regtype_str, rel_swizzle, rel_offset,
             rel_rbracket);

    // Some of the source mods need to generate instructions to a temp
    //  register, in which case we'll replace the register name.
    const SourceMod mod = arg->src_mod;
    const int inplace = ( (mod == SRCMOD_NONE) || (mod == SRCMOD_NEGATE) ||
                          ((mod == SRCMOD_ABS) && support_nv2(ctx)) );

    if (!inplace)
    {
        const size_t len = 64;
        char *stackbuf = (char *) alloca(len);
        regtype_str = allocate_ARB1_scratch_reg_name(ctx, stackbuf, len);
        regnum_str[0] = '\0'; // move value to scratch register.
        rel_lbracket = "";   // scratch register won't use array.
        rel_rbracket = "";
        rel_offset[0] = '\0';
        rel_swizzle[0] = '\0';
        rel_regtype_str = "";
    } // if

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            output_line(ctx, "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",
                        regtype_str, buf);
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            output_line(ctx,
                "MAD %s, %s, { 2.0, 2.0, 2.0, 2.0 }, { -1.0, -1.0, -1.0, -1.0 };",
                regtype_str, buf);
            break;

        case SRCMOD_COMPLEMENT:
            output_line(ctx, "SUB %s, { 1.0, 1.0, 1.0, 1.0 }, %s;",
                        regtype_str, buf);
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",
                        regtype_str, buf);
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ currently unsupported in arb1");
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW currently unsupported in arb1");
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            if (!support_nv2(ctx))  // GL_NV_vertex_program2_option adds this.
                output_line(ctx, "ABS %s, %s;", regtype_str, buf);
            else
            {
                premod_str = (mod == SRCMOD_ABSNEGATE) ? "-|" : "|";
                postmod_str = "|";
            } // else
            break;

        case SRCMOD_NOT:
            fail(ctx, "SRCMOD_NOT currently unsupported in arb1");
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    char swizzle_str[6];
    size_t i = 0;

    if (support_nv4(ctx))  // vFace must be output as "vFace.x" in nv4.
    {
        if (arg->regtype == REG_TYPE_MISCTYPE)
        {
            if ( ((const MiscTypeType) arg->regnum) == MISCTYPE_TYPE_FACE )
            {
                swizzle_str[i++] = '.';
                swizzle_str[i++] = 'x';
            } // if
        } // if
    } // if

    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';

        // .xxxx is the same as .x, but .xx is illegal...scalar or full!
        if (replicate_swizzle(arg->swizzle))
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        else
        {
            swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
            swizzle_str[i++] = swizzle_channels[arg->swizzle_w];
        } // else
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s", premod_str,
             regtype_str, regnum_str, rel_lbracket,
             rel_regtype_str, rel_swizzle, rel_offset, rel_rbracket,
             swizzle_str, postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}